

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

float Abc_NtkGetArea(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    pvVar4 = Abc_FrameReadLibLut();
    fVar7 = 0.0;
    if (pvVar4 != (void *)0x0) {
      iVar1 = *(int *)((long)pvVar4 + 8);
      iVar3 = Abc_NtkGetFaninMax(pNtk);
      if (iVar1 < iVar3) {
        fVar7 = 0.0;
      }
      else {
        lVar5 = (long)pNtk->vObjs->nSize;
        fVar7 = 0.0;
        if (0 < lVar5) {
          lVar6 = 0;
          do {
            pvVar2 = pNtk->vObjs->pArray[lVar6];
            if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
              fVar7 = fVar7 + *(float *)((long)pvVar4 +
                                        (long)*(int *)((long)pvVar2 + 0x1c) * 4 + 0x10);
            }
            lVar6 = lVar6 + 1;
          } while (lVar5 != lVar6);
        }
      }
    }
    return fVar7;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                ,0xd8,"float Abc_NtkGetArea(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkGetArea( Abc_Ntk_t * pNtk )
{
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pObj;
    float Counter = 0.0;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    if ( pLutLib && pLutLib->LutMax >= Abc_NtkGetFaninMax(pNtk) )
    {
        Abc_NtkForEachNode( pNtk, pObj, i )
            Counter += pLutLib->pLutAreas[Abc_ObjFaninNum(pObj)];
    }
    return Counter;
}